

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O1

void __thiscall
btStaticPlaneShape::processAllTriangles
          (btStaticPlaneShape *this,btTriangleCallback *callback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btScalar bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  float local_68;
  float fStack_64;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  fVar5 = (aabbMax->m_floats[0] - aabbMin->m_floats[0]) * 0.5;
  fVar8 = (aabbMax->m_floats[1] - aabbMin->m_floats[1]) * 0.5;
  fVar1 = (aabbMax->m_floats[2] - aabbMin->m_floats[2]) * 0.5;
  fVar1 = fVar1 * fVar1 + fVar5 * fVar5 + fVar8 * fVar8;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  uVar22 = *(undefined8 *)aabbMax->m_floats;
  uVar21 = *(undefined8 *)aabbMin->m_floats;
  fVar7 = (float)uVar21;
  fVar12 = (float)((ulong)uVar21 >> 0x20);
  fVar5 = aabbMax->m_floats[2];
  bVar15 = aabbMin->m_floats[2];
  fVar8 = (this->m_planeNormal).m_floats[2];
  if (ABS(fVar8) <= 0.70710677) {
    fVar8 = (this->m_planeNormal).m_floats[0];
    fVar10 = (this->m_planeNormal).m_floats[1];
    fVar8 = fVar8 * fVar8 + fVar10 * fVar10;
    if (fVar8 < 0.0) {
      fVar10 = sqrtf(fVar8);
      fVar7 = (float)uVar21;
      fVar12 = (float)((ulong)uVar21 >> 0x20);
    }
    else {
      fVar10 = SQRT(fVar8);
    }
    fVar14 = 0.0;
    fVar10 = 1.0 / fVar10;
    fVar8 = fVar8 * fVar10;
    fVar9 = (this->m_planeNormal).m_floats[0] * fVar10;
    fVar3 = -(this->m_planeNormal).m_floats[1] * fVar10;
    fVar4 = (this->m_planeNormal).m_floats[3] * fVar10;
    fVar6 = (this->m_planeNormal).m_floats[2];
    fVar2 = -fVar6 * fVar9;
    fVar6 = fVar6 * fVar3;
    fVar10 = (this->m_planeNormal).m_floats[2] * fVar10 * -0.0;
  }
  else {
    fVar10 = (this->m_planeNormal).m_floats[1];
    fVar10 = fVar10 * fVar10 + fVar8 * fVar8;
    if (fVar10 < 0.0) {
      fVar2 = sqrtf(fVar10);
      fVar7 = (float)uVar21;
      fVar12 = (float)((ulong)uVar21 >> 0x20);
    }
    else {
      fVar2 = SQRT(fVar10);
    }
    fVar2 = 1.0 / fVar2;
    fVar4 = -0.0;
    fVar9 = -(this->m_planeNormal).m_floats[2] * fVar2;
    fVar14 = (this->m_planeNormal).m_floats[1] * fVar2;
    fVar8 = (this->m_planeNormal).m_floats[0];
    fVar2 = fVar2 * fVar10;
    fVar6 = fVar14 * -fVar8;
    fVar10 = 0.0;
    fVar8 = fVar8 * fVar9;
    fVar3 = 0.0;
  }
  fVar13 = (this->m_planeNormal).m_floats[2];
  fVar11 = (fVar5 + bVar15) * 0.5;
  local_68 = (float)uVar22;
  fStack_64 = (float)((ulong)uVar22 >> 0x20);
  fVar2 = fVar1 * fVar2;
  fVar6 = fVar1 * fVar6;
  fVar8 = fVar8 * fVar1;
  fVar16 = (local_68 + fVar7) * 0.5;
  fVar17 = (fStack_64 + fVar12) * 0.5;
  uVar22 = *(undefined8 *)(this->m_planeNormal).m_floats;
  fVar5 = (float)uVar22;
  fVar7 = (float)((ulong)uVar22 >> 0x20);
  fVar12 = (fVar13 * fVar11 + fVar5 * fVar16 + fVar17 * fVar7) - this->m_planeConstant;
  fVar11 = fVar11 - fVar13 * fVar12;
  fVar16 = fVar16 - fVar12 * fVar5;
  fVar17 = fVar17 - fVar12 * fVar7;
  fVar5 = fVar3 * fVar1 + fVar16;
  fVar7 = fVar9 * fVar1 + fVar17;
  fVar12 = fVar14 * fVar1 + fVar11;
  fVar18 = fVar2 + fVar5;
  fVar19 = fVar6 + fVar7;
  fVar13 = fVar8 + fVar12;
  auVar23._4_4_ = fVar19;
  auVar23._0_4_ = fVar18;
  auVar23._8_4_ = fVar13;
  auVar23._12_4_ = 0;
  local_58._4_4_ = fVar19;
  local_58._0_4_ = fVar18;
  local_58._8_4_ = fVar13;
  local_58._12_4_ = 0;
  uVar22 = CONCAT44(fVar6,fVar2);
  local_48._4_4_ = fVar7 - fVar6;
  local_48._0_4_ = fVar5 - fVar2;
  local_48._8_4_ = fVar12 - fVar8;
  local_48._12_4_ = 0;
  fVar11 = fVar11 - fVar14 * fVar1;
  fVar16 = fVar16 - fVar3 * fVar1;
  fVar17 = fVar17 - fVar9 * fVar1;
  fVar2 = fVar16 - fVar2;
  fVar6 = fVar17 - fVar6;
  fVar5 = fVar11 - fVar8;
  auVar20._4_4_ = fVar6;
  auVar20._0_4_ = fVar2;
  auVar20._8_4_ = fVar5;
  auVar20._12_4_ = 0;
  local_38._4_4_ = fVar6;
  local_38._0_4_ = fVar2;
  local_38._8_4_ = fVar5;
  local_38._12_4_ = 0;
  (*callback->_vptr_btTriangleCallback[2])
            (callback,local_58,0,0,in_R8,in_R9,auVar20,uVar22,
             CONCAT44(fVar1 * fVar4 * 0.0,fVar1 * fVar10),auVar23);
  local_48._4_4_ = fVar17 + (float)((ulong)uVar22 >> 0x20);
  local_48._0_4_ = fVar16 + (float)uVar22;
  local_48._8_4_ = fVar11 + fVar8;
  local_48._12_4_ = 0;
  local_58 = auVar20;
  local_38 = auVar23;
  (*callback->_vptr_btTriangleCallback[2])(callback,local_58,0,1);
  return;
}

Assistant:

void	btStaticPlaneShape::processAllTriangles(btTriangleCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{

	btVector3 halfExtents = (aabbMax - aabbMin) * btScalar(0.5);
	btScalar radius = halfExtents.length();
	btVector3 center = (aabbMax + aabbMin) * btScalar(0.5);
	
	//this is where the triangles are generated, given AABB and plane equation (normal/constant)

	btVector3 tangentDir0,tangentDir1;

	//tangentDir0/tangentDir1 can be precalculated
	btPlaneSpace1(m_planeNormal,tangentDir0,tangentDir1);

	btVector3 supVertex0,supVertex1;

	btVector3 projectedCenter = center - (m_planeNormal.dot(center) - m_planeConstant)*m_planeNormal;
	
	btVector3 triangle[3];
	triangle[0] = projectedCenter + tangentDir0*radius + tangentDir1*radius;
	triangle[1] = projectedCenter + tangentDir0*radius - tangentDir1*radius;
	triangle[2] = projectedCenter - tangentDir0*radius - tangentDir1*radius;

	callback->processTriangle(triangle,0,0);

	triangle[0] = projectedCenter - tangentDir0*radius - tangentDir1*radius;
	triangle[1] = projectedCenter - tangentDir0*radius + tangentDir1*radius;
	triangle[2] = projectedCenter + tangentDir0*radius + tangentDir1*radius;

	callback->processTriangle(triangle,0,1);

}